

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-async.c
# Opt level: O3

int run_benchmark_million_async(void)

{
  uint *puVar1;
  async_container *paVar2;
  int iVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uv_loop_t *puVar7;
  uv_thread_t *puVar8;
  long lVar9;
  uv_async_t *handle;
  uv_timer_t timer_handle;
  
  puVar8 = (uv_thread_t *)&stack0xffffffffffffff48;
  loop = uv_default_loop();
  puVar7 = (uv_loop_t *)0x8000008;
  container = (async_container *)malloc(0x8000008);
  if (container == (async_container *)0x0) {
LAB_0010b1e0:
    run_benchmark_million_async_cold_7();
LAB_0010b1e5:
    puVar8 = (uv_thread_t *)puVar7;
    run_benchmark_million_async_cold_2();
LAB_0010b1ea:
    run_benchmark_million_async_cold_3();
LAB_0010b1ef:
    loop = (uv_loop_t *)puVar8;
    run_benchmark_million_async_cold_4();
  }
  else {
    puVar1 = &container->handles_seen;
    container->async_events = 0;
    *puVar1 = 0;
    lVar9 = 8;
    do {
      handle = (uv_async_t *)((long)container->async_handles[0].handle_queue + lVar9 + -0x28);
      puVar7 = loop;
      iVar3 = uv_async_init(loop,handle,async_cb);
      if (iVar3 != 0) {
        run_benchmark_million_async_cold_1();
        goto LAB_0010b1e0;
      }
      handle->data = (void *)0x0;
      lVar9 = lVar9 + 0x80;
    } while (lVar9 != 0x8000008);
    puVar7 = loop;
    iVar3 = uv_timer_init(loop,(uv_timer_t *)&stack0xffffffffffffff48);
    if (iVar3 != 0) goto LAB_0010b1e5;
    iVar3 = uv_timer_start((uv_timer_t *)&stack0xffffffffffffff48,timer_cb,5000,0);
    if (iVar3 != 0) goto LAB_0010b1ea;
    puVar8 = &thread_id;
    iVar3 = uv_thread_create(&thread_id,thread_cb,(void *)0x0);
    if (iVar3 != 0) goto LAB_0010b1ef;
    iVar3 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar3 == 0) {
      pcVar4 = fmt((double)container->async_events);
      pcVar5 = fmt((double)container->async_events / 5.0);
      pcVar6 = fmt((double)container->handles_seen);
      printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",0x4014000000000000,
             pcVar4,pcVar5,pcVar6);
      free(container);
      puVar7 = uv_default_loop();
      uv_walk(puVar7,close_walk_cb,(void *)0x0);
      uv_run(puVar7,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar3 = uv_loop_close(loop);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0010b1f9;
    }
  }
  run_benchmark_million_async_cold_5();
LAB_0010b1f9:
  run_benchmark_million_async_cold_6();
  paVar2 = container;
  container->async_events = container->async_events + 1;
  loop->data = loop;
  return (int)paVar2;
}

Assistant:

BENCHMARK_IMPL(million_async) {
  uv_timer_t timer_handle;
  uv_async_t* handle;
  uv_loop_t* loop;
  int timeout;
  unsigned i;

  loop = uv_default_loop();
  timeout = 5000;

  container = malloc(sizeof(*container));
  ASSERT_NOT_NULL(container);
  container->async_events = 0;
  container->handles_seen = 0;

  for (i = 0; i < ARRAY_SIZE(container->async_handles); i++) {
    handle = container->async_handles + i;
    ASSERT(0 == uv_async_init(loop, handle, async_cb));
    handle->data = NULL;
  }

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, timeout, 0));
  ASSERT(0 == uv_thread_create(&thread_id, thread_cb, NULL));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  printf("%s async events in %.1f seconds (%s/s, %s unique handles seen)\n",
          fmt(container->async_events),
          timeout / 1000.,
          fmt(container->async_events / (timeout / 1000.)),
          fmt(container->handles_seen));
  free(container);

  MAKE_VALGRIND_HAPPY();
  return 0;
}